

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool SingleSpace(Lexer *lexer,Node *node)

{
  uint local_24;
  Node *pNStack_20;
  uint c;
  Node *node_local;
  Lexer *lexer_local;
  
  if (node->content != (Node *)0x0) {
    pNStack_20 = node->content;
    if (pNStack_20->next != (Node *)0x0) {
      return no;
    }
    if (pNStack_20->type != TextNode) {
      return no;
    }
    if ((pNStack_20->end - pNStack_20->start == 1) && (lexer->lexbuf[pNStack_20->start] == ' ')) {
      return yes;
    }
    if (pNStack_20->end - pNStack_20->start == 2) {
      local_24 = 0;
      node_local = (Node *)lexer;
      prvTidyGetUTF8(lexer->lexbuf + pNStack_20->start,&local_24);
      if (local_24 == 0xa0) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

static Bool SingleSpace( Lexer* lexer, Node* node )
{
    if ( node->content )
    {
        node = node->content;

        if ( node->next != NULL )
            return no;

        if ( node->type != TextNode )
            return no;

        if ( (node->end - node->start) == 1 &&
             lexer->lexbuf[node->start] == ' ' )
            return yes;

        if ( (node->end - node->start) == 2 )
        {
            uint c = 0;
            TY_(GetUTF8)( lexer->lexbuf + node->start, &c );
            if ( c == 160 )
                return yes;
        }
    }

    return no;
}